

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

class_<ImPlotStyle,_leaked_ptr<ImPlotStyle>_> * __thiscall
pybind11::class_<ImPlotStyle,leaked_ptr<ImPlotStyle>>::
def_property_static<pybind11::is_method,pybind11::return_value_policy,char[38]>
          (class_<ImPlotStyle,leaked_ptr<ImPlotStyle>> *this,char *name,cpp_function *fget,
          cpp_function *fset,is_method *extra,return_value_policy *extra_1,char (*extra_2) [38])

{
  char (*pacVar1) [38];
  function_record *rec_func;
  function_record *pfVar2;
  char *pcVar3;
  
  rec_func = class_<ImPlotStyle,_leaked_ptr<ImPlotStyle>_>::get_function_record
                       ((fget->super_function).super_object.super_handle.m_ptr);
  pfVar2 = class_<ImPlotStyle,_leaked_ptr<ImPlotStyle>_>::get_function_record
                     ((fset->super_function).super_object.super_handle.m_ptr);
  if (rec_func != (function_record *)0x0) {
    pacVar1 = (char (*) [38])rec_func->doc;
    rec_func->field_0x59 = rec_func->field_0x59 | 0x10;
    (rec_func->scope).m_ptr = (extra->class_).m_ptr;
    rec_func->policy = *extra_1;
    rec_func->doc = *extra_2;
    if (pacVar1 != extra_2) {
      free(pacVar1);
      pcVar3 = strdup(rec_func->doc);
      rec_func->doc = pcVar3;
    }
  }
  if (pfVar2 != (function_record *)0x0) {
    pacVar1 = (char (*) [38])pfVar2->doc;
    pfVar2->field_0x59 = pfVar2->field_0x59 | 0x10;
    (pfVar2->scope).m_ptr = (extra->class_).m_ptr;
    pfVar2->policy = *extra_1;
    pfVar2->doc = *extra_2;
    if (pacVar1 != extra_2) {
      free(pacVar1);
      pcVar3 = strdup(pfVar2->doc);
      pfVar2->doc = pcVar3;
    }
    if (rec_func == (function_record *)0x0) {
      rec_func = pfVar2;
    }
  }
  detail::generic_type::def_property_static_impl
            ((generic_type *)this,name,(fget->super_function).super_object.super_handle.m_ptr,
             (fset->super_function).super_object.super_handle.m_ptr,rec_func);
  return (class_<ImPlotStyle,_leaked_ptr<ImPlotStyle>_> *)this;
}

Assistant:

class_ &def_property_static(const char *name, const cpp_function &fget, const cpp_function &fset, const Extra& ...extra) {
        static_assert( 0 == detail::constexpr_sum(std::is_base_of<arg, Extra>::value...),
                      "Argument annotations are not allowed for properties");
        auto rec_fget = get_function_record(fget), rec_fset = get_function_record(fset);
        auto *rec_active = rec_fget;
        if (rec_fget) {
           char *doc_prev = rec_fget->doc; /* 'extra' field may include a property-specific documentation string */
           detail::process_attributes<Extra...>::init(extra..., rec_fget);
           if (rec_fget->doc && rec_fget->doc != doc_prev) {
              free(doc_prev);
              rec_fget->doc = strdup(rec_fget->doc);
           }
        }
        if (rec_fset) {
            char *doc_prev = rec_fset->doc;
            detail::process_attributes<Extra...>::init(extra..., rec_fset);
            if (rec_fset->doc && rec_fset->doc != doc_prev) {
                free(doc_prev);
                rec_fset->doc = strdup(rec_fset->doc);
            }
            if (! rec_active) rec_active = rec_fset;
        }
        def_property_static_impl(name, fget, fset, rec_active);
        return *this;
    }